

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_list.c
# Opt level: O0

void list_store_list(t_list_store *x,t_symbol *s,int argc,t_atom *argv)

{
  int iVar1;
  _outlet *p_Var2;
  t_atom *to;
  t_atom *ptVar3;
  long lVar4;
  t_atom tStack_68;
  t_atom *local_58;
  undefined1 local_50 [8];
  t_alist y;
  int outc;
  int n;
  t_atom *outv;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_list_store *x_local;
  
  ptVar3 = &tStack_68;
  y.l_vec._0_4_ = (x->x_alist).l_n + argc;
  if ((int)y.l_vec < 100) {
    ptVar3 = &tStack_68 + -(long)(int)y.l_vec;
    local_58 = ptVar3;
  }
  else {
    local_58 = (t_atom *)getbytes((long)(int)y.l_vec << 4);
  }
  to = local_58;
  ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c4cca;
  atoms_copy(argc,argv,to);
  if ((x->x_alist).l_npointer == 0) {
    iVar1 = (x->x_alist).l_n;
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c4d5a;
    alist_toatoms(&x->x_alist,to + argc,0,iVar1);
    iVar1 = (int)y.l_vec;
    p_Var2 = x->x_out1;
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c4d75;
    outlet_list(p_Var2,&s_list,iVar1,to);
  }
  else {
    iVar1 = (x->x_alist).l_n;
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c4cee;
    alist_clone(&x->x_alist,(t_alist *)local_50,0,iVar1);
    iVar1 = (x->x_alist).l_n;
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c4d0f;
    alist_toatoms((t_alist *)local_50,to + argc,0,iVar1);
    iVar1 = (int)y.l_vec;
    p_Var2 = x->x_out1;
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c4d2a;
    outlet_list(p_Var2,&s_list,iVar1,to);
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c4d33;
    alist_clear((t_alist *)local_50);
  }
  tStack_68.a_w._7_1_ = 1;
  if (99 < (int)y.l_vec) {
    lVar4 = (long)(int)y.l_vec;
    ptVar3[-1].a_w.w_symbol = (t_symbol *)0x1c4d91;
    freebytes(to,lVar4 << 4);
  }
  return;
}

Assistant:

static void list_store_list(t_list_store *x, t_symbol *s,
    int argc, t_atom *argv)
{
    t_atom *outv;
    int n, outc = x->x_alist.l_n + argc;
    ATOMS_ALLOCA(outv, outc);
    atoms_copy(argc, argv, outv);
    if (x->x_alist.l_npointer)
    {
        t_alist y;
        alist_clone(&x->x_alist, &y, 0, x->x_alist.l_n);
        alist_toatoms(&y, outv+argc, 0, x->x_alist.l_n);
        outlet_list(x->x_out1, &s_list, outc, outv);
        alist_clear(&y);
    }
    else
    {
        alist_toatoms(&x->x_alist, outv+argc, 0, x->x_alist.l_n);
        outlet_list(x->x_out1, &s_list, outc, outv);
    }
    ATOMS_FREEA(outv, outc);
}